

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<google::protobuf::Map<bool,proto2_unittest::Proto2MapEnum>,void>
               (Map<bool,_proto2_unittest::Proto2MapEnum> *container,ostream *os)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  NodeBase *pNVar4;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  uVar1 = (container->super_KeyMapBase<bool>).super_UntypedMapBase.index_of_first_non_null_;
  uVar2 = (ulong)uVar1;
  if (uVar1 != (container->super_KeyMapBase<bool>).super_UntypedMapBase.num_buckets_) {
    pNVar4 = (container->super_KeyMapBase<bool>).super_UntypedMapBase.table_[uVar2];
    if (pNVar4 == (NodeBase *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
    lVar3 = 0;
    while ((lVar3 == 0 ||
           (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar3 != 0x20))) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      PrintTo<bool_const,proto2_unittest::Proto2MapEnum>
                ((pair<const_bool,_proto2_unittest::Proto2MapEnum> *)(pNVar4 + 1),os);
      lVar3 = lVar3 + 1;
      pNVar4 = pNVar4->next;
      if (pNVar4 == (NodeBase *)0x0) {
        do {
          uVar1 = (int)uVar2 + 1;
          uVar2 = (ulong)uVar1;
          if ((container->super_KeyMapBase<bool>).super_UntypedMapBase.num_buckets_ <= uVar1) {
            if (lVar3 == 0) goto LAB_008492fc;
            goto LAB_008492e7;
          }
          pNVar4 = (container->super_KeyMapBase<bool>).super_UntypedMapBase.table_[uVar1];
        } while (pNVar4 == (NodeBase *)0x0);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
LAB_008492e7:
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
  }
LAB_008492fc:
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }